

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.cpp
# Opt level: O1

void glu::getProgramResourceName
               (Functions *gl,deUint32 program,deUint32 programInterface,deUint32 index,string *dst)

{
  char *pcVar1;
  pointer pcVar2;
  deUint32 dVar3;
  GLenum err;
  ostream *poVar4;
  TestError *this;
  vector<char,_std::allocator<char>_> buf;
  string local_1c0;
  vector<char,_std::allocator<char>_> local_1a0 [15];
  
  dVar3 = getProgramResourceUint(gl,program,programInterface,index,0x92f9);
  if (0 < (int)dVar3) {
    std::vector<char,_std::allocator<char>_>::vector
              (local_1a0,(long)(int)(dVar3 + 1),(allocator_type *)&local_1c0);
    (*gl->getProgramResourceName)
              (program,programInterface,index,
               (int)local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
               (int)local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,(GLsizei *)0x0,
               local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    err = (*gl->getError)();
    checkError(err,"glGetProgramResourceName()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluProgramInterfaceQuery.cpp"
               ,0x31);
    pcVar2 = local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (char *)dst->_M_string_length;
    strlen(local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start);
    std::__cxx11::string::_M_replace((ulong)dst,0,pcVar1,(ulong)pcVar2);
    if (local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start != (char *)0x0) {
      operator_delete(local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0[0].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Empty name returned for ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," at index ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  this = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  tcu::TestError::TestError(this,&local_1c0);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void getProgramResourceName (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index, std::string& dst)
{
	const int length = getProgramResourceInt(gl, program, programInterface, index, GL_NAME_LENGTH);

	if (length > 0)
	{
		std::vector<char> buf(length+1);
		gl.getProgramResourceName(program, programInterface, index, (int)buf.size(), DE_NULL, &buf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceName()");

		dst = (const char*)&buf[0];
	}
	else
	{
		std::ostringstream msg;
		msg << "Empty name returned for " << programInterface << " at index " << index;
		throw tcu::TestError(msg.str());
	}
}